

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecules.cpp
# Opt level: O0

Molecule * __thiscall Molecules::Get(Molecules *this,KEY_ID s)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_unsigned_long,_Molecule>,_false> local_38;
  _Node_iterator_base<std::pair<const_unsigned_long,_Molecule>,_false> local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_Molecule>,_false> local_28;
  iterator i;
  KEY_ID s_local;
  Molecules *this_local;
  
  i.super__Node_iterator_base<std::pair<const_unsigned_long,_Molecule>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_Molecule>,_false>)
       (_Node_iterator_base<std::pair<const_unsigned_long,_Molecule>,_false>)s;
  std::__detail::_Node_iterator<std::pair<const_unsigned_long,_Molecule>,_false,_false>::
  _Node_iterator((_Node_iterator<std::pair<const_unsigned_long,_Molecule>,_false,_false> *)&local_28
                );
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_Molecule,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_>_>
       ::find(&this->molecules,(key_type *)&i);
  local_28._M_cur = local_30._M_cur;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_Molecule,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_>_>
       ::end(&this->molecules);
  bVar1 = std::__detail::operator!=(&local_28,&local_38);
  if (bVar1) {
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_unsigned_long,_Molecule>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_Molecule>,_false,_false> *)
                        &local_28);
    this_local = (Molecules *)&ppVar2->second;
  }
  else {
    this_local = (Molecules *)0x0;
  }
  return (Molecule *)this_local;
}

Assistant:

Molecule *Molecules::Get(KEY_ID s)
{
	unordered_map<KEY_ID, Molecule>::iterator i;
//	cerr << "molecules.size(): "<< molecules.size() << endl;
	i = molecules.find(s);
	if (i != molecules.end())
		return &(i->second);
	return NULL;
}